

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall cmInstallTargetGenerator::GenerateScript(cmInstallTargetGenerator *this,ostream *os)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  char *m1;
  string local_1e8 [32];
  ostringstream local_1c8 [8];
  ostringstream msg;
  allocator local_39;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  
  this_00 = this->Target;
  local_18 = os;
  os_local = (ostream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"EXCLUDE_FROM_ALL",&local_39);
  bVar1 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar2 = std::operator<<((ostream *)local_1c8,"WARNING: Target \"");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2,"\" has EXCLUDE_FROM_ALL set and will not be built by default ")
    ;
    poVar2 = std::operator<<(poVar2,"but an install rule has been provided for it.  CMake does ");
    std::operator<<(poVar2,"not define behavior for this case.");
    std::__cxx11::ostringstream::str();
    m1 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Message(m1,"Warning");
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::ostringstream::~ostringstream(local_1c8);
  }
  cmInstallGenerator::GenerateScript(&this->super_cmInstallGenerator,local_18);
  return;
}

Assistant:

void cmInstallTargetGenerator::GenerateScript(std::ostream& os)
{
  // Warn if installing an exclude-from-all target.
  if (this->Target->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
    std::ostringstream msg;
    msg << "WARNING: Target \"" << this->Target->GetName()
        << "\" has EXCLUDE_FROM_ALL set and will not be built by default "
        << "but an install rule has been provided for it.  CMake does "
        << "not define behavior for this case.";
    cmSystemTools::Message(msg.str().c_str(), "Warning");
  }

  // Perform the main install script generation.
  this->cmInstallGenerator::GenerateScript(os);
}